

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellLoad(xmlShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  bool bVar3;
  htmlDocPtr pxStack_38;
  int html;
  xmlDocPtr doc;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *filename_local;
  xmlShellCtxtPtr ctxt_local;
  
  bVar3 = false;
  if ((ctxt == (xmlShellCtxtPtr)0x0) || (filename == (char *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->doc != (xmlDocPtr)0x0) {
      bVar3 = ctxt->doc->type == XML_HTML_DOCUMENT_NODE;
    }
    if (bVar3) {
      pxStack_38 = htmlParseFile(filename,(char *)0x0);
    }
    else {
      pxStack_38 = xmlReadFile(filename,(char *)0x0,0);
    }
    if (pxStack_38 == (xmlDocPtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      if (ctxt->loaded == 1) {
        xmlFreeDoc(ctxt->doc);
      }
      ctxt->loaded = 1;
      xmlXPathFreeContext(ctxt->pctxt);
      (*xmlFree)(ctxt->filename);
      ctxt->doc = pxStack_38;
      ctxt->node = (xmlNodePtr)pxStack_38;
      pxVar1 = xmlXPathNewContext(pxStack_38);
      ctxt->pctxt = pxVar1;
      pxVar2 = xmlCanonicPath((xmlChar *)filename);
      ctxt->filename = (char *)pxVar2;
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlShellLoad(xmlShellCtxtPtr ctxt, char *filename,
             xmlNodePtr node ATTRIBUTE_UNUSED,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlDocPtr doc;
    int html = 0;

    if ((ctxt == NULL) || (filename == NULL)) return(-1);
    if (ctxt->doc != NULL)
        html = (ctxt->doc->type == XML_HTML_DOCUMENT_NODE);

    if (html) {
#ifdef LIBXML_HTML_ENABLED
        doc = htmlParseFile(filename, NULL);
#else
        fprintf(ctxt->output, "HTML support not compiled in\n");
        doc = NULL;
#endif /* LIBXML_HTML_ENABLED */
    } else {
        doc = xmlReadFile(filename,NULL,0);
    }
    if (doc != NULL) {
        if (ctxt->loaded == 1) {
            xmlFreeDoc(ctxt->doc);
        }
        ctxt->loaded = 1;
#ifdef LIBXML_XPATH_ENABLED
        xmlXPathFreeContext(ctxt->pctxt);
#endif /* LIBXML_XPATH_ENABLED */
        xmlFree(ctxt->filename);
        ctxt->doc = doc;
        ctxt->node = (xmlNodePtr) doc;
#ifdef LIBXML_XPATH_ENABLED
        ctxt->pctxt = xmlXPathNewContext(doc);
#endif /* LIBXML_XPATH_ENABLED */
        ctxt->filename = (char *) xmlCanonicPath((xmlChar *) filename);
    } else
        return (-1);
    return (0);
}